

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O3

void Fxu_HeapSingleCheck(Fxu_HeapSingle *p)

{
  int iVar1;
  Fxu_Single *pSingle;
  int iVar2;
  
  p->i = 1;
  if (0 < p->nItems) {
    iVar2 = 1;
    do {
      pSingle = p->pTree[iVar2];
      if (pSingle == (Fxu_Single *)0x0) {
        return;
      }
      if (pSingle->HNum != iVar2) {
        __assert_fail("pSingle->HNum == p->i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                      ,0xa0,"void Fxu_HeapSingleCheck(Fxu_HeapSingle *)");
      }
      Fxu_HeapSingleCheckOne(p,pSingle);
      iVar1 = p->i;
      iVar2 = iVar1 + 1;
      p->i = iVar2;
    } while (iVar1 < p->nItems);
  }
  return;
}

Assistant:

void Fxu_HeapSingleCheck( Fxu_HeapSingle * p )
{
    Fxu_Single * pSingle;
    Fxu_HeapSingleForEachItem( p, pSingle )
    {
        assert( pSingle->HNum == p->i );
        Fxu_HeapSingleCheckOne( p, pSingle );
    }
}